

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::CalcItemRectClosestPoint(ImVec2 *pos,bool on_edge,float outward)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImRect local_18;
  
  IVar1 = (GImGui->CurrentWindow->DC).LastItemRect.Min;
  IVar2 = (GImGui->CurrentWindow->DC).LastItemRect.Max;
  local_18.Min.x = IVar1.x;
  local_18.Min.y = IVar1.y;
  local_18.Max.x = IVar2.x;
  local_18.Max.y = IVar2.y;
  local_18.Min.y = local_18.Min.y - outward;
  local_18.Min.x = local_18.Min.x - outward;
  local_18.Max.y = outward + local_18.Max.y;
  local_18.Max.x = outward + local_18.Max.x;
  IVar1 = ImRect::GetClosestPoint(&local_18,*pos,on_edge);
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcItemRectClosestPoint(const ImVec2& pos, bool on_edge, float outward)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImRect rect = window->DC.LastItemRect;
    rect.Expand(outward);
    return rect.GetClosestPoint(pos, on_edge);
}